

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

int xmlHashGrow(xmlHashTablePtr hash,uint size)

{
  uint uVar1;
  xmlHashEntry *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  uint uVar5;
  undefined4 uVar6;
  xmlHashEntry *__s;
  xmlHashEntry *pxVar7;
  int iVar8;
  uint uVar9;
  xmlHashEntry *pxVar10;
  size_t __n;
  
  __n = (ulong)size * 0x28;
  __s = (xmlHashEntry *)(*xmlMalloc)(__n);
  if (__s == (xmlHashEntry *)0x0) {
    iVar8 = -1;
  }
  else {
    iVar8 = 0;
    memset(__s,0,__n);
    uVar1 = hash->size;
    if ((ulong)uVar1 != 0) {
      pxVar2 = hash->table;
      pxVar7 = pxVar2;
      while (pxVar7->hashValue != 0) {
        pxVar7 = pxVar7 + 1;
        if (pxVar2 + uVar1 <= pxVar7) {
          pxVar7 = pxVar2;
        }
      }
      for (uVar9 = 0; uVar9 != uVar1; uVar9 = uVar9 + 1) {
        if (pxVar7->hashValue != 0) {
          pxVar10 = __s + (pxVar7->hashValue & size - 1);
          while (pxVar10->hashValue != 0) {
            pxVar10 = pxVar10 + 1;
            if (__s + size <= pxVar10) {
              pxVar10 = __s;
            }
          }
          pxVar10->payload = pxVar7->payload;
          uVar5 = pxVar7->hashValue;
          uVar6 = *(undefined4 *)&pxVar7->field_0x4;
          pxVar3 = pxVar7->key;
          pxVar4 = pxVar7->key3;
          pxVar10->key2 = pxVar7->key2;
          pxVar10->key3 = pxVar4;
          pxVar10->hashValue = uVar5;
          *(undefined4 *)&pxVar10->field_0x4 = uVar6;
          pxVar10->key = pxVar3;
        }
        pxVar7 = pxVar7 + 1;
        if (pxVar2 + uVar1 <= pxVar7) {
          pxVar7 = hash->table;
        }
      }
      (*xmlFree)(hash->table);
    }
    hash->table = __s;
    hash->size = size;
  }
  return iVar8;
}

Assistant:

static int
xmlHashGrow(xmlHashTablePtr hash, unsigned size) {
    const xmlHashEntry *oldentry, *oldend, *end;
    xmlHashEntry *table;
    unsigned oldsize, i;

    /* Add 0 to avoid spurious -Wtype-limits warning on 64-bit GCC */
    if ((size_t) size + 0 > SIZE_MAX / sizeof(table[0]))
        return(-1);
    table = xmlMalloc(size * sizeof(table[0]));
    if (table == NULL)
        return(-1);
    memset(table, 0, size * sizeof(table[0]));

    oldsize = hash->size;
    if (oldsize == 0)
        goto done;

    oldend = &hash->table[oldsize];
    end = &table[size];

    /*
     * Robin Hood sorting order is maintained if we
     *
     * - compute hash indices with modulo
     * - resize by an integer factor
     * - start to copy from the beginning of a probe sequence
     */
    oldentry = hash->table;
    while (oldentry->hashValue != 0) {
        if (++oldentry >= oldend)
            oldentry = hash->table;
    }

    for (i = 0; i < oldsize; i++) {
        if (oldentry->hashValue != 0) {
            xmlHashEntry *entry = &table[oldentry->hashValue & (size - 1)];

            while (entry->hashValue != 0) {
                if (++entry >= end)
                    entry = table;
            }
            *entry = *oldentry;
        }

        if (++oldentry >= oldend)
            oldentry = hash->table;
    }

    xmlFree(hash->table);

done:
    hash->table = table;
    hash->size = size;

    return(0);
}